

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_lpf1_clear_cache(ma_lpf1 *pLPF)

{
  ma_lpf1 *pLPF_local;
  
  if (pLPF == (ma_lpf1 *)0x0) {
    pLPF_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    if (pLPF->format == ma_format_f32) {
      (pLPF->a).f32 = 0.0;
    }
    else {
      (pLPF->a).f32 = 0.0;
    }
    pLPF_local._4_4_ = MA_SUCCESS;
  }
  return pLPF_local._4_4_;
}

Assistant:

MA_API ma_result ma_lpf1_clear_cache(ma_lpf1* pLPF)
{
    if (pLPF == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pLPF->format == ma_format_f32) {
        pLPF->a.f32 = 0;
    } else {
        pLPF->a.s32 = 0;
    }

    return MA_SUCCESS;
}